

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::TrackInstrsForScopeObjectRemoval(GlobOpt *this,Instr *instr)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  ArgSlot AVar5;
  ushort uVar6;
  int iVar7;
  Opnd *pOVar8;
  Opnd *pOVar9;
  JITTimeFunctionBody *pJVar10;
  undefined4 *puVar11;
  StackSym *pSVar12;
  Func *func_00;
  RegOpnd *pRVar13;
  Instr *pIVar14;
  ScriptContextInfo *pSVar15;
  undefined4 extraout_var;
  AddrOpnd *src1Opnd;
  Instr *assignUndefined;
  Opnd *dstOpnd_1;
  Opnd *srcOpnd_1;
  Instr *assignInstr;
  Opnd *dstOpnd;
  Opnd *srcOpnd;
  StackSym *argOutSym;
  StackSym *pSStack_58;
  ArgSlot param;
  StackSym *undefinedSym;
  ArgSlot i;
  Instr *pIStack_48;
  ArgSlot extraActuals;
  Instr *argOutInstr;
  Func *inlinerFunc;
  Func *func;
  ArgSlot formalsCount;
  ArgSlot actualsCount;
  Opnd *src1;
  Opnd *dst;
  Instr *instr_local;
  GlobOpt *this_local;
  
  pOVar8 = IR::Instr::GetDst(instr);
  pOVar9 = IR::Instr::GetSrc1(instr);
  if ((((instr->m_opcode == Ld_A) && (bVar3 = IR::Opnd::IsRegOpnd(pOVar9), bVar3)) &&
      (bVar3 = Func::IsStackArgsEnabled(instr->m_func), bVar3)) &&
     (bVar3 = IR::Opnd::IsScopeObjOpnd(pOVar9,instr->m_func), bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x57f,
                       "(!instr->m_func->IsStackArgsEnabled() || !src1->IsScopeObjOpnd(instr->m_func))"
                       ,"There can be no aliasing for scope object.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar11 = 0;
  }
  bVar3 = Func::IsStackArgsEnabled(instr->m_func);
  if ((bVar3) && (bVar3 = IsLoopPrePass(this), !bVar3)) {
    if (instr->m_opcode == LdSlotArr) {
      pOVar9 = IR::Instr::GetSrc1(instr);
      bVar3 = IR::Opnd::IsScopeObjOpnd(pOVar9,instr->m_func);
      if (bVar3) {
        pJVar10 = Func::GetJITFunctionBody(instr->m_func);
        bVar3 = JITTimeFunctionBody::HasImplicitArgIns(pJVar10);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x589,"(!instr->m_func->GetJITFunctionBody()->HasImplicitArgIns())",
                             "No mapping is required in this case. So it should already be generating ArgIns."
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        pFVar1 = instr->m_func;
        pSVar12 = IR::Opnd::GetStackSym(pOVar8);
        Func::TrackFormalsArraySym(pFVar1,(pSVar12->super_Sym).m_id);
      }
    }
    else if (instr->m_opcode == InlineeStart) {
      bVar3 = Func::IsInlined(instr->m_func);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x58f,"(instr->m_func->IsInlined())","instr->m_func->IsInlined()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar11 = 0;
      }
      uVar4 = instr->m_func->actualCount - 1;
      pJVar10 = Func::GetJITFunctionBody(instr->m_func);
      AVar5 = JITTimeFunctionBody::GetInParamsCount(pJVar10);
      uVar6 = AVar5 - 1;
      pFVar1 = instr->m_func;
      func_00 = Func::GetParentFunc(pFVar1);
      pOVar8 = IR::Instr::GetSrc2(instr);
      pSVar12 = IR::Opnd::GetStackSym(pOVar8);
      pIStack_48 = StackSym::GetInstrDef(pSVar12);
      bVar3 = Func::IsInlinedConstructor(instr->m_func);
      if (bVar3) {
        pOVar8 = IR::Instr::GetSrc1(pIStack_48);
        pSVar12 = IR::Opnd::GetStackSym(pOVar8);
        pIVar14 = StackSym::GetInstrDef(pSVar12);
        if (pIVar14 != (Instr *)0x0) {
          pOVar8 = IR::Instr::GetSrc1(pIStack_48);
          pSVar12 = IR::Opnd::GetStackSym(pOVar8);
          pIVar14 = StackSym::GetInstrDef(pSVar12);
          if (pIVar14->m_opcode != NewScObjectNoCtor) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x59e,
                               "(argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr || argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor)"
                               ,
                               "argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr || argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor"
                              );
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
        pOVar8 = IR::Instr::GetSrc2(pIStack_48);
        pSVar12 = IR::Opnd::GetStackSym(pOVar8);
        pIStack_48 = StackSym::GetInstrDef(pSVar12);
      }
      if (uVar6 < uVar4) {
        for (undefinedSym._4_2_ = 0; undefinedSym._4_2_ < (ushort)(uVar4 - uVar6);
            undefinedSym._4_2_ = undefinedSym._4_2_ + 1) {
          pOVar8 = IR::Instr::GetSrc2(pIStack_48);
          pSVar12 = IR::Opnd::GetStackSym(pOVar8);
          pIStack_48 = StackSym::GetInstrDef(pSVar12);
        }
      }
      pSStack_58 = (StackSym *)0x0;
      for (argOutSym._6_2_ = uVar6; argOutSym._6_2_ != 0; argOutSym._6_2_ = argOutSym._6_2_ - 1) {
        srcOpnd = (Opnd *)0x0;
        pOVar8 = IR::Instr::GetSrc1(pIStack_48);
        if (pOVar8 != (Opnd *)0x0) {
          pOVar8 = IR::Instr::GetSrc1(pIStack_48);
          bVar3 = IR::Opnd::IsRegOpnd(pOVar8);
          if (bVar3) {
            pOVar8 = IR::Instr::GetSrc1(pIStack_48);
            srcOpnd = (Opnd *)IR::Opnd::GetStackSym(pOVar8);
          }
          else {
            srcOpnd = (Opnd *)StackSym::New(func_00);
            pOVar8 = IR::Instr::GetSrc1(pIStack_48);
            pRVar13 = IR::RegOpnd::New((StackSym *)srcOpnd,TyVar,func_00);
            pIVar14 = IR::Instr::New(Ld_A,&pRVar13->super_Opnd,pOVar8,func_00);
            IR::Instr::InsertBefore(instr,pIVar14);
          }
        }
        bVar3 = Func::HasStackSymForFormal(pFVar1,argOutSym._6_2_ - 1);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x5c3,"(!func->HasStackSymForFormal(param - 1))",
                             "!func->HasStackSymForFormal(param - 1)");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar11 = 0;
        }
        if (uVar4 < argOutSym._6_2_) {
          if (uVar6 <= uVar4) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x5cf,"(formalsCount > actualsCount)","formalsCount > actualsCount")
            ;
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          if (pSStack_58 == (StackSym *)0x0) {
            pSStack_58 = StackSym::New(func_00);
            pSVar15 = Func::GetScriptContextInfo(func_00);
            iVar7 = (*pSVar15->_vptr_ScriptContextInfo[1])();
            src1Opnd = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar7),AddrOpndKindDynamicMisc,
                                         func_00,false,(Var)0x0);
            pRVar13 = IR::RegOpnd::New(pSStack_58,TyVar,func_00);
            pIVar14 = IR::Instr::New(Ld_A,&pRVar13->super_Opnd,&src1Opnd->super_Opnd,func_00);
            IR::Instr::InsertBefore(instr,pIVar14);
          }
          Func::TrackStackSymForFormalIndex(pFVar1,argOutSym._6_2_ - 1,pSStack_58);
        }
        else {
          if (srcOpnd == (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x5c7,"(argOutSym)","argOutSym");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          Func::TrackStackSymForFormalIndex(pFVar1,argOutSym._6_2_ - 1,(StackSym *)srcOpnd);
          pOVar8 = IR::Instr::GetSrc2(pIStack_48);
          pSVar12 = IR::Opnd::GetStackSym(pOVar8);
          pIStack_48 = StackSym::GetInstrDef(pSVar12);
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::TrackInstrsForScopeObjectRemoval(IR::Instr * instr)
{
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();

    if (instr->m_opcode == Js::OpCode::Ld_A && src1->IsRegOpnd())
    {
        AssertMsg(!instr->m_func->IsStackArgsEnabled() || !src1->IsScopeObjOpnd(instr->m_func), "There can be no aliasing for scope object.");
    }

    // The following is to track formals array for Stack Arguments optimization with Formals
    if (instr->m_func->IsStackArgsEnabled() && !this->IsLoopPrePass())
    {
        if (instr->m_opcode == Js::OpCode::LdSlotArr)
        {
            if (instr->GetSrc1()->IsScopeObjOpnd(instr->m_func))
            {
                AssertMsg(!instr->m_func->GetJITFunctionBody()->HasImplicitArgIns(), "No mapping is required in this case. So it should already be generating ArgIns.");
                instr->m_func->TrackFormalsArraySym(dst->GetStackSym()->m_id);
            }
        }
        else if (instr->m_opcode == Js::OpCode::InlineeStart)
        {
            Assert(instr->m_func->IsInlined());
            Js::ArgSlot actualsCount = instr->m_func->actualCount - 1;
            Js::ArgSlot formalsCount = instr->m_func->GetJITFunctionBody()->GetInParamsCount() - 1;

            Func * func = instr->m_func;
            Func * inlinerFunc = func->GetParentFunc(); //Inliner's func

            IR::Instr * argOutInstr = instr->GetSrc2()->GetStackSym()->GetInstrDef();

            //The argout immediately before the InlineeStart will be the ArgOut for NewScObject
            //So we don't want to track the stack sym for this argout.- Skipping it here.
            if (instr->m_func->IsInlinedConstructor())
            {
                //PRE might introduce a second defintion for the Src1. So assert for the opcode only when it has single definition.
                Assert(argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef() == nullptr ||
                    argOutInstr->GetSrc1()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::NewScObjectNoCtor);
                argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
            }
            if (formalsCount < actualsCount)
            {
                Js::ArgSlot extraActuals = actualsCount - formalsCount;

                //Skipping extra actuals passed
                for (Js::ArgSlot i = 0; i < extraActuals; i++)
                {
                    argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
                }
            }

            StackSym * undefinedSym = nullptr;

            for (Js::ArgSlot param = formalsCount; param > 0; param--)
            {
                StackSym * argOutSym = nullptr;

                if (argOutInstr->GetSrc1())
                {
                    if (argOutInstr->GetSrc1()->IsRegOpnd())
                    {
                        argOutSym = argOutInstr->GetSrc1()->GetStackSym();
                    }
                    else
                    {
                        // We will always have ArgOut instr - so the source operand will not be removed.
                        argOutSym = StackSym::New(inlinerFunc);
                        IR::Opnd * srcOpnd = argOutInstr->GetSrc1();
                        IR::Opnd * dstOpnd = IR::RegOpnd::New(argOutSym, TyVar, inlinerFunc);
                        IR::Instr * assignInstr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, inlinerFunc);
                        instr->InsertBefore(assignInstr);
                    }
                }

                Assert(!func->HasStackSymForFormal(param - 1));

                if (param <= actualsCount)
                {
                    Assert(argOutSym);
                    func->TrackStackSymForFormalIndex(param - 1, argOutSym);
                    argOutInstr = argOutInstr->GetSrc2()->GetStackSym()->GetInstrDef();
                }
                else
                {
                    /*When param is out of range of actuals count, load undefined*/
                    // TODO: saravind: This will insert undefined for each of the param not having an actual. - Clean up this by having a sym for undefined on func ?
                    Assert(formalsCount > actualsCount);
                    if (undefinedSym == nullptr)
                    {
                        undefinedSym = StackSym::New(inlinerFunc);
                        IR::Opnd * srcOpnd = IR::AddrOpnd::New(inlinerFunc->GetScriptContextInfo()->GetUndefinedAddr(), IR::AddrOpndKindDynamicMisc, inlinerFunc);
                        IR::Opnd * dstOpnd = IR::RegOpnd::New(undefinedSym, TyVar, inlinerFunc);
                        IR::Instr * assignUndefined = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, inlinerFunc);
                        instr->InsertBefore(assignUndefined);
                    }
                    func->TrackStackSymForFormalIndex(param - 1, undefinedSym);
                }
            }
        }
    }
}